

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.cc
# Opt level: O3

void cnn::TensorTools::Randomize(Tensor *d)

{
  bool bVar1;
  undefined1 auVar2 [16];
  undefined8 uVar3;
  byte bVar4;
  byte bVar5;
  ulong uVar6;
  ulong uVar7;
  ushort uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  
  uVar6 = (ulong)(d->d).nd;
  if (uVar6 == 0) {
    auVar9 = ZEXT816(0) << 0x40;
  }
  else {
    auVar11 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar12 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar16 = ZEXT1664((undefined1  [16])0x0);
    auVar13 = vpbroadcastq_avx512f();
    uVar7 = 0;
    do {
      auVar14 = vpbroadcastq_avx512f();
      auVar15 = vmovdqa64_avx512f(auVar16);
      auVar16 = vporq_avx512f(auVar14,auVar11);
      auVar14 = vporq_avx512f(auVar14,auVar12);
      uVar3 = vpcmpuq_avx512f(auVar14,auVar13,2);
      bVar4 = (byte)uVar3;
      uVar3 = vpcmpuq_avx512f(auVar16,auVar13,2);
      bVar5 = (byte)uVar3;
      uVar8 = CONCAT11(bVar5,bVar4);
      auVar16 = vmovdqu32_avx512f(*(undefined1 (*) [64])((d->d).d + uVar7));
      auVar14._4_4_ = (uint)((byte)(uVar8 >> 1) & 1) * auVar16._4_4_;
      auVar14._0_4_ = (uint)(bVar4 & 1) * auVar16._0_4_;
      auVar14._8_4_ = (uint)((byte)(uVar8 >> 2) & 1) * auVar16._8_4_;
      auVar14._12_4_ = (uint)((byte)(uVar8 >> 3) & 1) * auVar16._12_4_;
      auVar14._16_4_ = (uint)((byte)(uVar8 >> 4) & 1) * auVar16._16_4_;
      auVar14._20_4_ = (uint)((byte)(uVar8 >> 5) & 1) * auVar16._20_4_;
      auVar14._24_4_ = (uint)((byte)(uVar8 >> 6) & 1) * auVar16._24_4_;
      auVar14._28_4_ = (uint)((byte)(uVar8 >> 7) & 1) * auVar16._28_4_;
      auVar14._32_4_ = (uint)(bVar5 & 1) * auVar16._32_4_;
      auVar14._36_4_ = (uint)(bVar5 >> 1 & 1) * auVar16._36_4_;
      auVar14._40_4_ = (uint)(bVar5 >> 2 & 1) * auVar16._40_4_;
      auVar14._44_4_ = (uint)(bVar5 >> 3 & 1) * auVar16._44_4_;
      auVar14._48_4_ = (uint)(bVar5 >> 4 & 1) * auVar16._48_4_;
      auVar14._52_4_ = (uint)(bVar5 >> 5 & 1) * auVar16._52_4_;
      auVar14._56_4_ = (uint)(bVar5 >> 6 & 1) * auVar16._56_4_;
      auVar14._60_4_ = (uint)(bVar5 >> 7) * auVar16._60_4_;
      uVar7 = uVar7 + 0x10;
      auVar16 = vpaddd_avx512f(auVar14,auVar15);
    } while ((uVar6 + 0xf & 0xfffffffffffffff0) != uVar7);
    auVar11 = vmovdqa32_avx512f(auVar16);
    auVar12._0_4_ = (uint)(bVar4 & 1) * auVar11._0_4_ | (uint)!(bool)(bVar4 & 1) * auVar15._0_4_;
    bVar1 = (bool)((byte)(uVar8 >> 1) & 1);
    auVar12._4_4_ = (uint)bVar1 * auVar11._4_4_ | (uint)!bVar1 * auVar15._4_4_;
    bVar1 = (bool)((byte)(uVar8 >> 2) & 1);
    auVar12._8_4_ = (uint)bVar1 * auVar11._8_4_ | (uint)!bVar1 * auVar15._8_4_;
    bVar1 = (bool)((byte)(uVar8 >> 3) & 1);
    auVar12._12_4_ = (uint)bVar1 * auVar11._12_4_ | (uint)!bVar1 * auVar15._12_4_;
    bVar1 = (bool)((byte)(uVar8 >> 4) & 1);
    auVar12._16_4_ = (uint)bVar1 * auVar11._16_4_ | (uint)!bVar1 * auVar15._16_4_;
    bVar1 = (bool)((byte)(uVar8 >> 5) & 1);
    auVar12._20_4_ = (uint)bVar1 * auVar11._20_4_ | (uint)!bVar1 * auVar15._20_4_;
    bVar1 = (bool)((byte)(uVar8 >> 6) & 1);
    auVar12._24_4_ = (uint)bVar1 * auVar11._24_4_ | (uint)!bVar1 * auVar15._24_4_;
    bVar1 = (bool)((byte)(uVar8 >> 7) & 1);
    auVar12._28_4_ = (uint)bVar1 * auVar11._28_4_ | (uint)!bVar1 * auVar15._28_4_;
    auVar12._32_4_ = (uint)(bVar5 & 1) * auVar11._32_4_ | (uint)!(bool)(bVar5 & 1) * auVar15._32_4_;
    bVar1 = (bool)(bVar5 >> 1 & 1);
    auVar12._36_4_ = (uint)bVar1 * auVar11._36_4_ | (uint)!bVar1 * auVar15._36_4_;
    bVar1 = (bool)(bVar5 >> 2 & 1);
    auVar12._40_4_ = (uint)bVar1 * auVar11._40_4_ | (uint)!bVar1 * auVar15._40_4_;
    bVar1 = (bool)(bVar5 >> 3 & 1);
    auVar12._44_4_ = (uint)bVar1 * auVar11._44_4_ | (uint)!bVar1 * auVar15._44_4_;
    bVar1 = (bool)(bVar5 >> 4 & 1);
    auVar12._48_4_ = (uint)bVar1 * auVar11._48_4_ | (uint)!bVar1 * auVar15._48_4_;
    bVar1 = (bool)(bVar5 >> 5 & 1);
    auVar12._52_4_ = (uint)bVar1 * auVar11._52_4_ | (uint)!bVar1 * auVar15._52_4_;
    bVar1 = (bool)(bVar5 >> 6 & 1);
    auVar12._56_4_ = (uint)bVar1 * auVar11._56_4_ | (uint)!bVar1 * auVar15._56_4_;
    auVar12._60_4_ =
         (uint)(bVar5 >> 7) * auVar11._60_4_ | (uint)!(bool)(bVar5 >> 7) * auVar15._60_4_;
    auVar10 = vextracti64x4_avx512f(auVar12,1);
    auVar11 = vpaddd_avx512f(auVar12,ZEXT3264(auVar10));
    auVar9 = vpaddd_avx(auVar11._0_16_,auVar11._16_16_);
    auVar2 = vpshufd_avx(auVar9,0xee);
    auVar9 = vpaddd_avx(auVar9,auVar2);
    auVar2 = vpshufd_avx(auVar9,0x55);
    auVar9 = vpaddd_avx(auVar9,auVar2);
    auVar9 = vcvtudq2pd_avx512vl(auVar9);
  }
  auVar9 = vsqrtsd_avx(auVar9,auVar9);
  Randomize(d,(float)(2.449489742783178 / auVar9._0_8_));
  return;
}

Assistant:

void TensorTools::Randomize(Tensor& d) {
  Randomize(d, sqrt(6) / sqrt(d.d.sum_dims()));
}